

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O3

void __thiscall lan::db_bit::~db_bit(db_bit *this)

{
  db_bit *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  db_bit local_60;
  
  if ((this->data != (void *)0x0) || ((this->key)._M_string_length != 0)) {
    free(this->data);
    local_60.key._M_dataplus._M_p = (pointer)&local_60.key.field_2;
    local_60.key._M_string_length = 0;
    local_60.key.field_2._M_local_buf[0] = '\0';
    local_60.data = (void *)0x0;
    local_60.pre = (db_bit *)0x0;
    local_60.nex = (db_bit *)0x0;
    local_60.lin = (db_bit *)0x0;
    local_60.con = (db_bit *)0x0;
    ~db_bit(&local_60);
  }
  this_00 = this->lin;
  if (this_00 != (db_bit *)0x0) {
    ~db_bit(this_00);
    operator_delete(this_00,0x50);
    this->lin = (db_bit *)0x0;
  }
  pcVar1 = (this->key)._M_dataplus._M_p;
  paVar2 = &(this->key).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

~ db_bit (){
            if(data or not key.empty()) { ::free(data) ; db_bit();}
            if(lin) {delete lin; lin = nullptr;}
        }